

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-light.c
# Opt level: O3

void borg_update_light(void)

{
  ushort *puVar1;
  byte *pbVar2;
  ushort uVar3;
  borg_grid *pbVar4;
  borg_grid *pbVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  _Bool _Var10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint8_t uVar15;
  uint uVar16;
  ulong uVar17;
  uint8_t uVar18;
  int iVar19;
  wchar_t wVar20;
  long lVar21;
  uint8_t uVar22;
  ulong uVar23;
  uint uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  int dy;
  uint uVar27;
  uint uVar28;
  bool bVar29;
  
  if (0 < borg_light_n) {
    lVar13 = 0;
    do {
      borg_grids[borg_light_y[lVar13]][borg_light_x[lVar13]].info =
           borg_grids[borg_light_y[lVar13]][borg_light_x[lVar13]].info & 0xffef;
      lVar13 = lVar13 + 1;
    } while (lVar13 < borg_light_n);
  }
  iVar9 = borg.c.y;
  iVar8 = borg.c.x;
  borg_light_n = 0;
  if (borg_items[(ulong)z_info->pack_size + 5].iqty != '\0') {
    lVar21 = (long)borg.c.y;
    pbVar4 = borg_grids[lVar21];
    lVar13 = (long)borg.c.x;
    pbVar4[lVar13].info = pbVar4[lVar13].info | 0x10;
    uVar15 = (uint8_t)iVar9;
    borg_light_y[borg_light_n] = uVar15;
    uVar25 = (uint8_t)iVar8;
    borg_light_x[borg_light_n] = uVar25;
    piVar7 = borg.trait;
    borg_light_n = borg_light_n + 1;
    if (0 < borg.trait[0x1a]) {
      pbVar5 = borg_grids[lVar21 + 1];
      lVar6 = lVar13 * 0xc;
      pbVar5[lVar13].info = pbVar5[lVar13].info | 0x10;
      uVar26 = uVar15 + '\x01';
      borg_light_y[borg_light_n] = uVar26;
      borg_light_x[borg_light_n] = uVar25;
      borg_light_n = borg_light_n + 1;
      lVar21 = (&DAT_002f9138)[lVar21];
      puVar1 = (ushort *)(lVar21 + 2 + lVar6);
      *puVar1 = *puVar1 | 0x10;
      uVar22 = uVar15 + 0xff;
      borg_light_y[borg_light_n] = uVar22;
      borg_light_x[borg_light_n] = uVar25;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar4[lVar13 + 1].info = (byte)pbVar4[lVar13 + 1].info | 0x10;
      borg_light_y[borg_light_n] = uVar15;
      uVar18 = uVar25 + '\x01';
      borg_light_x[borg_light_n] = uVar18;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar4[lVar13 + -1].info = (byte)pbVar4[lVar13 + -1].info | 0x10;
      borg_light_y[borg_light_n] = uVar15;
      uVar25 = uVar25 + 0xff;
      borg_light_x[borg_light_n] = uVar25;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar5[lVar13 + 1].info = (byte)pbVar5[lVar13 + 1].info | 0x10;
      borg_light_y[borg_light_n] = uVar26;
      borg_light_x[borg_light_n] = uVar18;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar5[lVar13 + -1].info = (byte)pbVar5[lVar13 + -1].info | 0x10;
      borg_light_y[borg_light_n] = uVar26;
      borg_light_x[borg_light_n] = uVar25;
      borg_light_n = borg_light_n + 1;
      pbVar2 = (byte *)(lVar21 + 0xe + lVar6);
      *pbVar2 = *pbVar2 | 0x10;
      borg_light_y[borg_light_n] = uVar22;
      borg_light_x[borg_light_n] = uVar18;
      borg_light_n = borg_light_n + 1;
      pbVar2 = (byte *)(lVar21 + -10 + lVar6);
      *pbVar2 = *pbVar2 | 0x10;
      borg_light_y[borg_light_n] = uVar22;
      borg_light_x[borg_light_n] = uVar25;
      borg_light_n = borg_light_n + 1;
      if ((1 < piVar7[0x1a]) && (iVar8 - 3U < 0xc1 && iVar9 - 3U < 0x3d)) {
        _Var10 = borg_cave_floor_bold(iVar9 + L'\x02',iVar8);
        iVar9 = borg.c.y;
        iVar8 = borg.c.x;
        lVar13 = (long)borg.c.x;
        if (_Var10) {
          pbVar4 = borg_grids[(long)borg.c.y + 2];
          pbVar4[lVar13].info = pbVar4[lVar13].info | 0x10;
          uVar25 = (char)iVar9 + '\x02';
          borg_light_y[borg_light_n] = uVar25;
          uVar15 = (uint8_t)iVar8;
          borg_light_x[borg_light_n] = uVar15;
          borg_light_n = borg_light_n + 1;
          *(byte *)&pbVar4[lVar13 + 2].info = (byte)pbVar4[lVar13 + 2].info | 0x10;
          borg_light_y[borg_light_n] = uVar25;
          borg_light_x[borg_light_n] = uVar15 + '\x02';
          borg_light_n = borg_light_n + 1;
          *(byte *)&pbVar4[lVar13 + -2].info = (byte)pbVar4[lVar13 + -2].info | 0x10;
          borg_light_y[borg_light_n] = uVar25;
          borg_light_x[borg_light_n] = uVar15 + 0xfe;
          borg_light_n = borg_light_n + 1;
        }
        _Var10 = borg_cave_floor_bold(iVar9 + L'\xfffffffe',iVar8);
        iVar9 = borg.c.y;
        iVar8 = borg.c.x;
        lVar13 = (long)borg.c.x;
        if (_Var10) {
          lVar21 = *(long *)(borg_view_x + (long)borg.c.y * 8 + 0x2320);
          puVar1 = (ushort *)(lVar21 + 2 + lVar13 * 0xc);
          *puVar1 = *puVar1 | 0x10;
          uVar25 = (char)iVar9 + 0xfe;
          borg_light_y[borg_light_n] = uVar25;
          uVar15 = (uint8_t)iVar8;
          borg_light_x[borg_light_n] = uVar15;
          borg_light_n = borg_light_n + 1;
          pbVar2 = (byte *)(lVar21 + 0x1a + lVar13 * 0xc);
          *pbVar2 = *pbVar2 | 0x10;
          borg_light_y[borg_light_n] = uVar25;
          borg_light_x[borg_light_n] = uVar15 + '\x02';
          borg_light_n = borg_light_n + 1;
          pbVar2 = (byte *)(lVar21 + -0x16 + lVar13 * 0xc);
          *pbVar2 = *pbVar2 | 0x10;
          borg_light_y[borg_light_n] = uVar25;
          borg_light_x[borg_light_n] = uVar15 + 0xfe;
          borg_light_n = borg_light_n + 1;
        }
        _Var10 = borg_cave_floor_bold(iVar9,iVar8 + L'\x02');
        iVar9 = borg.c.y;
        iVar8 = borg.c.x;
        lVar21 = (long)borg.c.y;
        lVar13 = (long)borg.c.x;
        if (_Var10) {
          borg_grids[lVar21][lVar13 + 2].info = borg_grids[lVar21][lVar13 + 2].info | 0x10;
          uVar15 = (uint8_t)iVar9;
          borg_light_y[borg_light_n] = uVar15;
          uVar25 = (char)iVar8 + '\x02';
          borg_light_x[borg_light_n] = uVar25;
          borg_light_n = borg_light_n + 1;
          borg_grids[lVar21 + 1][lVar13 + 2].info = borg_grids[lVar21 + 1][lVar13 + 2].info | 0x10;
          borg_light_y[borg_light_n] = uVar15 + '\x01';
          borg_light_x[borg_light_n] = uVar25;
          borg_light_n = borg_light_n + 1;
          puVar1 = (ushort *)((&DAT_002f9138)[lVar21] + 0x1a + lVar13 * 0xc);
          *puVar1 = *puVar1 | 0x10;
          borg_light_y[borg_light_n] = uVar15 + 0xff;
          borg_light_x[borg_light_n] = uVar25;
          borg_light_n = borg_light_n + 1;
        }
        _Var10 = borg_cave_floor_bold(iVar9,iVar8 + L'\xfffffffe');
        iVar9 = borg.c.y;
        iVar8 = borg.c.x;
        if (_Var10) {
          lVar21 = (long)borg.c.y;
          lVar13 = (long)borg.c.x;
          borg_grids[lVar21][lVar13 + -2].info = borg_grids[lVar21][lVar13 + -2].info | 0x10;
          uVar15 = (uint8_t)iVar9;
          borg_light_y[borg_light_n] = uVar15;
          uVar25 = (char)iVar8 + 0xfe;
          borg_light_x[borg_light_n] = uVar25;
          borg_light_n = borg_light_n + 1;
          borg_grids[lVar21 + 2][lVar13 + -2].info = borg_grids[lVar21 + 2][lVar13 + -2].info | 0x10
          ;
          borg_light_y[borg_light_n] = uVar15 + '\x02';
          borg_light_x[borg_light_n] = uVar25;
          borg_light_n = borg_light_n + 1;
          puVar1 = (ushort *)(*(long *)(borg_view_x + lVar21 * 8 + 0x2320) + -0x16 + lVar13 * 0xc);
          *puVar1 = *puVar1 | 0x10;
          borg_light_y[borg_light_n] = uVar15 + 0xfe;
          borg_light_x[borg_light_n] = uVar25;
          borg_light_n = borg_light_n + 1;
        }
      }
    }
    uVar11 = borg.trait[0x1a];
    if (((2 < (int)uVar11) && (borg.c.y - 4U < 0x3b)) && (borg.c.x - 4U < 0xbf)) {
      uVar27 = 5;
      if (uVar11 < 5) {
        uVar27 = uVar11;
      }
      _Var10 = borg_cave_floor_bold(borg.c.y + L'\x03',borg.c.x + L'\x03');
      iVar9 = borg.c.y;
      iVar8 = borg.c.x;
      wVar20 = borg.c.y + L'\x03';
      if (_Var10) {
        borg_grids[(long)borg.c.y + 3][(long)borg.c.x + 3].info =
             borg_grids[(long)borg.c.y + 3][(long)borg.c.x + 3].info | 0x10;
        borg_light_y[borg_light_n] = (char)iVar9 + '\x03';
        borg_light_x[borg_light_n] = (char)iVar8 + '\x03';
        borg_light_n = borg_light_n + 1;
      }
      _Var10 = borg_cave_floor_bold(wVar20,iVar8 + L'\xfffffffd');
      iVar9 = borg.c.y;
      iVar8 = borg.c.x;
      if (_Var10) {
        borg_grids[(long)borg.c.y + 3][(long)borg.c.x + -3].info =
             borg_grids[(long)borg.c.y + 3][(long)borg.c.x + -3].info | 0x10;
        borg_light_y[borg_light_n] = (char)iVar9 + '\x03';
        borg_light_x[borg_light_n] = (char)iVar8 + 0xfd;
        borg_light_n = borg_light_n + 1;
      }
      _Var10 = borg_cave_floor_bold(iVar9 + L'\xfffffffd',iVar8 + L'\x03');
      iVar9 = borg.c.y;
      iVar8 = borg.c.x;
      wVar20 = borg.c.y + L'\xfffffffd';
      if (_Var10) {
        puVar1 = (ushort *)
                 (*(long *)(borg_view_x + (long)borg.c.y * 8 + 0x2318) + 0x26 + (long)borg.c.x * 0xc
                 );
        *puVar1 = *puVar1 | 0x10;
        borg_light_y[borg_light_n] = (char)iVar9 + 0xfd;
        borg_light_x[borg_light_n] = (char)iVar8 + '\x03';
        borg_light_n = borg_light_n + 1;
      }
      _Var10 = borg_cave_floor_bold(wVar20,iVar8 + L'\xfffffffd');
      iVar9 = borg.c.y;
      iVar8 = borg.c.x;
      if (_Var10) {
        puVar1 = (ushort *)
                 (*(long *)(borg_view_x + (long)borg.c.y * 8 + 0x2318) + -0x22 +
                 (long)borg.c.x * 0xc);
        *puVar1 = *puVar1 | 0x10;
        borg_light_y[borg_light_n] = (char)iVar9 + 0xfd;
        borg_light_x[borg_light_n] = (char)iVar8 + 0xfd;
        borg_light_n = borg_light_n + 1;
      }
      uVar17 = 0;
      uVar11 = iVar9 - uVar27;
      if ((int)(iVar9 - uVar27) < 1) {
        uVar11 = 0;
      }
      uVar16 = 0x41;
      if ((int)(iVar9 + uVar27) < 0x41) {
        uVar16 = iVar9 + uVar27;
      }
      if ((int)uVar11 <= (int)uVar16) {
        iVar19 = 0xc5;
        if ((int)(iVar8 + uVar27) < 0xc5) {
          iVar19 = iVar8 + uVar27;
        }
        if (0 < (int)(iVar8 - uVar27)) {
          uVar17 = (ulong)(iVar8 - uVar27);
        }
        uVar23 = (ulong)uVar11;
        do {
          if ((int)uVar17 <= iVar19) {
            uVar12 = iVar9 - (int)uVar23;
            uVar11 = -uVar12;
            if (0 < (int)uVar12) {
              uVar11 = uVar12;
            }
            uVar14 = uVar17;
            lVar13 = uVar17 * 0xc + 2;
            uVar12 = iVar8 - (int)uVar17;
            do {
              uVar28 = -uVar12;
              if (0 < (int)uVar12) {
                uVar28 = uVar12;
              }
              if ((2 < uVar11) || (2 < uVar28)) {
                uVar24 = uVar28 + (uVar11 >> 1);
                if (uVar28 < uVar11) {
                  uVar24 = (uVar28 >> 1) + uVar11;
                }
                if (uVar24 <= uVar27) {
                  uVar3 = *(ushort *)(&borg_grids[uVar23]->feat + lVar13);
                  if ((uVar3 & 0x20) != 0) {
                    *(ushort *)(&borg_grids[uVar23]->feat + lVar13) = uVar3 | 0x10;
                    borg_light_y[borg_light_n] = (uint8_t)uVar23;
                    borg_light_x[borg_light_n] = (uint8_t)uVar14;
                    borg_light_n = borg_light_n + 1;
                  }
                }
              }
              uVar12 = uVar12 - 1;
              lVar13 = lVar13 + 0xc;
              bVar29 = (long)uVar14 < (long)iVar19;
              uVar14 = uVar14 + 1;
            } while (bVar29);
          }
          bVar29 = uVar23 < uVar16;
          uVar23 = uVar23 + 1;
        } while (bVar29);
      }
    }
  }
  return;
}

Assistant:

void borg_update_light(void)
{
    int i, x, y, min_x, max_x, min_y, max_y;

    /*** Clear old grids ***/

    /* Clear them all */
    for (i = 0; i < borg_light_n; i++) {
        y = borg_light_y[i];
        x = borg_light_x[i];

        /* Mark the grid as not "lite" */
        borg_grids[y][x].info &= ~BORG_LIGHT;
    }

    /* None left */
    borg_light_n = 0;

    /* Hack -- Player has no lite */
    if (borg_items[INVEN_LIGHT].iqty <= 0)
        return;

    /*** Collect the new "lite" grids ***/

    /* Player grid */
    borg_cave_light_hack(borg.c.y, borg.c.x);

    /* Radius 1 -- torch radius */
    if (borg.trait[BI_LIGHT] >= 1) {
        /* Adjacent grid */
        borg_cave_light_hack(borg.c.y + 1, borg.c.x);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x);
        borg_cave_light_hack(borg.c.y, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y, borg.c.x - 1);

        /* Diagonal grids */
        borg_cave_light_hack(borg.c.y + 1, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y + 1, borg.c.x - 1);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x - 1);
    }

    /* Radius 2 -- lantern radius */
    if (borg.trait[BI_LIGHT] >= 2 && borg.c.y + 2 < AUTO_MAX_Y
        && borg.c.y - 2 > 0 && borg.c.x + 2 < AUTO_MAX_X && borg.c.x - 2 > 0) {
        /* South of the player */
        if (borg_cave_floor_bold(borg.c.y + 2, borg.c.x)) {
            borg_cave_light_hack(borg.c.y + 2, borg.c.x);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x - 2);
        }

        /* North of the player */
        if (borg_cave_floor_bold(borg.c.y - 2, borg.c.x)) {
            borg_cave_light_hack(borg.c.y - 2, borg.c.x);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x - 2);
        }

        /* East of the player */
        if (borg_cave_floor_bold(borg.c.y, borg.c.x + 2)) {
            borg_cave_light_hack(borg.c.y, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y + 1, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y - 1, borg.c.x + 2);
        }

        /* West of the player */
        if (borg_cave_floor_bold(borg.c.y, borg.c.x - 2)) {
            borg_cave_light_hack(borg.c.y, borg.c.x - 2);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x - 2);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x - 2);
        }
    }

    /* Radius 3+ -- artifact radius */
    if (borg.trait[BI_LIGHT] >= 3 && borg.c.y + 3 < AUTO_MAX_Y
        && borg.c.y - 3 > 0 && borg.c.x + 3 < AUTO_MAX_X && borg.c.x - 3 > 0) {
        int d, p;

        /* Maximal radius */
        p = borg.trait[BI_LIGHT];

        /* Paranoia -- see "LITE_MAX" */
        if (p > 5)
            p = 5;

        /* South-East of the player */
        if (borg_cave_floor_bold(borg.c.y + 3, borg.c.x + 3)) {
            borg_cave_light_hack(borg.c.y + 3, borg.c.x + 3);
        }

        /* South-West of the player */
        if (borg_cave_floor_bold(borg.c.y + 3, borg.c.x - 3)) {
            borg_cave_light_hack(borg.c.y + 3, borg.c.x - 3);
        }

        /* North-East of the player */
        if (borg_cave_floor_bold(borg.c.y - 3, borg.c.x + 3)) {
            borg_cave_light_hack(borg.c.y - 3, borg.c.x + 3);
        }

        /* North-West of the player */
        if (borg_cave_floor_bold(borg.c.y - 3, borg.c.x - 3)) {
            borg_cave_light_hack(borg.c.y - 3, borg.c.x - 3);
        }

        /* Maximal north */
        min_y = borg.c.y - p;
        if (min_y < 0)
            min_y = 0;

        /* Maximal south */
        max_y = borg.c.y + p;
        if (max_y > AUTO_MAX_Y - 1)
            max_y = AUTO_MAX_Y - 1;

        /* Maximal west */
        min_x = borg.c.x - p;
        if (min_x < 0)
            min_x = 0;

        /* Maximal east */
        max_x = borg.c.x + p;
        if (max_x > AUTO_MAX_X - 1)
            max_x = AUTO_MAX_X - 1;

        /* Scan the maximal box */
        for (y = min_y; y <= max_y; y++) {
            for (x = min_x; x <= max_x; x++) {
                int dy = (borg.c.y > y) ? (borg.c.y - y) : (y - borg.c.y);
                int dx = (borg.c.x > x) ? (borg.c.x - x) : (x - borg.c.x);

                /* Skip the "central" grids (above) */
                if ((dy <= 2) && (dx <= 2))
                    continue;

                /* Hack -- approximate the distance */
                d = (dy > dx) ? (dy + (dx >> 1)) : (dx + (dy >> 1));

                /* Skip distant grids */
                if (d > p)
                    continue;

                /* Viewable, nearby, grids get "torch lit" */
                if (borg_grids[y][x].info & BORG_VIEW) {
                    /* This grid is "torch lit" */
                    borg_cave_light_hack(y, x);
                }
            }
        }
    }
}